

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O2

long c_drive(long num,long degree,long speed)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if ((ulong)num < 4) {
    lVar2 = 100;
    if ((ulong)speed < 100) {
      lVar2 = speed;
    }
    if (speed < 0) {
      lVar2 = 0;
    }
    uVar1 = -degree;
    if (0 < degree) {
      uVar1 = degree;
    }
    uVar3 = uVar1 % 0x168;
    if (uVar1 < 0x168) {
      uVar3 = uVar1;
    }
    if (r_debug != 0) {
      printf("\ndrive: degree %ld, speed %ld\n",uVar3,lVar2);
    }
    robots[num].d_heading = (int)uVar3;
    robots[num].d_speed = (int)lVar2;
    return 1;
  }
  __assert_fail("num >= 0 && num <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                ,0xb6,"long c_drive(long, long, long)");
}

Assistant:

long c_drive(long num, long degree, long speed)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  // speed = pop();
  if (speed < 0L)
    speed = 0L;
  else if (speed > 100L)
    speed = 100L;
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  if (r_debug)
    printf("\ndrive: degree %ld, speed %ld\n", degree, speed);

  /* update desired speed and heading */
  cur_robot->d_heading = (int)degree;
  cur_robot->d_speed = (int)speed;

  return (1L);
}